

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_log.c
# Opt level: O0

int mpt_connection_log(mpt_connection *con,char *from,int type,char *msg)

{
  size_t sVar1;
  ssize_t sVar2;
  long local_48;
  ssize_t ret;
  int len;
  int mlen;
  int flen;
  int8_t hdr [4];
  char *msg_local;
  int type_local;
  char *from_local;
  mpt_connection *con_local;
  
  if (((con->out).state & 0x10) == 0) {
    mlen._0_1_ = 0;
    mlen._1_1_ = (byte)type & 0x7f;
    ret._0_4_ = 2;
    len = 0;
    ret._4_4_ = 0;
    _flen = msg;
    if (from != (char *)0x0) {
      sVar1 = strlen(from);
      len = (int)sVar1;
      if ((type & 0x800U) != 0) {
        ret._0_4_ = 3;
        mlen._2_1_ = 1;
      }
    }
    local_48 = 0x100;
    if (_flen != (char *)0x0) {
      sVar1 = strlen(_flen);
      ret._4_4_ = (int)sVar1;
      local_48 = 0xfe;
    }
    if ((long)len < local_48 - (int)ret) {
      sVar2 = mpt_connection_push(con,(long)(int)ret,&mlen);
      if (sVar2 < 0) {
        con_local._4_4_ = (int)sVar2;
      }
      else {
        ret._0_4_ = 0x100 - (int)ret;
        if (from != (char *)0x0) {
          mpt_connection_push(con,(long)len,from);
          ret._0_4_ = (int)ret - len;
        }
        if (_flen != (char *)0x0) {
          mlen._0_1_ = 2;
          mpt_connection_push(con,1,&mlen);
          ret._0_4_ = (int)ret + -1;
          if (ret._4_4_ < (int)ret) {
            mpt_connection_push(con,(long)ret._4_4_,_flen);
            mlen._0_1_ = 3;
            mpt_connection_push(con,1,&mlen);
          }
          else {
            mpt_connection_push(con,(long)(int)ret,_flen);
            ret._0_4_ = 0;
          }
        }
        mpt_connection_push(con,0,(void *)0x0);
        con_local._4_4_ = 1;
        if ((int)ret != 0) {
          con_local._4_4_ = 2;
        }
      }
    }
    else {
      con_local._4_4_ = -0x11;
    }
  }
  else {
    con_local._4_4_ = -0x21;
  }
  return con_local._4_4_;
}

Assistant:

extern int mpt_connection_log(MPT_STRUCT(connection) *con, const char *from, int type, const char *msg)
{
	int8_t hdr[4];
	int flen, mlen, len;
	ssize_t ret;
	
	/* send log entry to contact */
	if ((con->out.state & MPT_OUTFLAG(Active))) {
		return MPT_MESGERR(InProgress);
	}
	hdr[0] = MPT_MESGTYPE(Output);
	hdr[1] = type & 0x7f;
	
	len = 2;
	mlen = flen = 0;
	if (from) {
		flen = strlen(from);
		if (type & MPT_ENUM(LogFunction)) {
			hdr[len++] = 0x1; /* SOH */
		}
	}
	ret = MPT_OUTPUT_LOGMSG_MAX;
	if (msg) {
		mlen = strlen(msg);
		ret -= 2;
	}
	if (flen >= (ret - len)) {
		return MPT_ERROR(MissingBuffer);
	}
	if ((ret = mpt_connection_push(con, len, hdr)) < 0) {
		return ret;
	}
	len = MPT_OUTPUT_LOGMSG_MAX - len;
	if (from) {
		mpt_connection_push(con, flen, from);
		len -= flen;
	}
	if (msg) {
		*hdr = 0x2; /* STX */
		mpt_connection_push(con, 1, hdr);
		--len;
		
		if (len > mlen) {
			mpt_connection_push(con, mlen, msg);
			*hdr = 0x3; /* ETX */
			mpt_connection_push(con, 1, hdr);
		} else {
			mpt_connection_push(con, len, msg);
			len = 0;
		}
	}
	mpt_connection_push(con, 0, 0);
	
	return len ? 2 : 1;
}